

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::InputSource::InputSource
          (InputSource *this,XMLCh *systemId,XMLCh *publicId,MemoryManager *manager)

{
  short *psVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar4;
  XMLCh *pXVar3;
  
  this->_vptr_InputSource = (_func_int **)&PTR__InputSource_0040bbd8;
  this->fMemoryManager = manager;
  this->fEncoding = (XMLCh *)0x0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fFatalErrorIfNotFound = true;
  if (publicId == (XMLCh *)0x0) {
    pXVar3 = (XMLCh *)0x0;
  }
  else {
    sVar4 = 0;
    do {
      psVar1 = (short *)((long)publicId + sVar4);
      sVar4 = sVar4 + 2;
    } while (*psVar1 != 0);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,sVar4);
    pXVar3 = (XMLCh *)CONCAT44(extraout_var,iVar2);
    memcpy(pXVar3,publicId,sVar4);
    manager = this->fMemoryManager;
  }
  this->fPublicId = pXVar3;
  if (systemId == (XMLCh *)0x0) {
    pXVar3 = (XMLCh *)0x0;
  }
  else {
    sVar4 = 0;
    do {
      psVar1 = (short *)((long)systemId + sVar4);
      sVar4 = sVar4 + 2;
    } while (*psVar1 != 0);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,sVar4);
    pXVar3 = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
    memcpy(pXVar3,systemId,sVar4);
  }
  this->fSystemId = pXVar3;
  return;
}

Assistant:

InputSource::InputSource(const  XMLCh* const   systemId
                        , const XMLCh* const   publicId
                        , MemoryManager* const manager) :

    fMemoryManager(manager)
    , fEncoding(0)
    , fPublicId(0)
    , fSystemId(0)
    , fFatalErrorIfNotFound(true)
{
    fPublicId = XMLString::replicate(publicId, fMemoryManager);
    fSystemId = XMLString::replicate(systemId, fMemoryManager);
}